

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

void __thiscall
tcu::LogShader::LogShader
          (LogShader *this,qpShaderType type,string *source,bool compileOk,string *infoLog)

{
  string *infoLog_local;
  bool compileOk_local;
  string *source_local;
  qpShaderType type_local;
  LogShader *this_local;
  
  this->m_type = type;
  std::__cxx11::string::string((string *)&this->m_source,(string *)source);
  this->m_compileOk = compileOk;
  std::__cxx11::string::string((string *)&this->m_infoLog,(string *)infoLog);
  return;
}

Assistant:

LogShader (qpShaderType type, const std::string& source, bool compileOk, const std::string& infoLog)
		: m_type		(type)
		, m_source		(source)
		, m_compileOk	(compileOk)
		, m_infoLog		(infoLog)
	{
	}